

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopFusion::ContainsBarriersOrFunctionCalls(LoopFusion *this,Loop *loop)

{
  bool bVar1;
  Op OVar2;
  BasicBlockListTy *this_00;
  reference pvVar3;
  Instruction *this_01;
  Op opcode;
  Instruction *inst;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  value_type_conflict2 *block;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockListTy *__range2;
  Loop *loop_local;
  LoopFusion *this_local;
  
  this_00 = Loop::GetBlocks(loop);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(this_00);
  block = (value_type_conflict2 *)
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::end(this_00);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       (_Node_iterator_base<unsigned_int,_false> *)&block);
    if (!bVar1) {
      return false;
    }
    pvVar3 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    ___begin3 = Function::FindBlock(this->containing_function_,*pvVar3);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__begin3);
    BasicBlock::begin((BasicBlock *)&__end3);
    BasicBlock::end((BasicBlock *)&inst);
    while (bVar1 = utils::operator!=(&__end3.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&inst), bVar1)
    {
      this_01 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
      OVar2 = Instruction::opcode(this_01);
      if ((((OVar2 == OpFunctionCall) || (OVar2 == OpControlBarrier)) || (OVar2 == OpMemoryBarrier))
         || (((OVar2 == OpTypeNamedBarrier || (OVar2 == OpNamedBarrierInitialize)) ||
             (OVar2 == OpMemoryNamedBarrier)))) {
        return true;
      }
      InstructionList::iterator::operator++(&__end3);
    }
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  } while( true );
}

Assistant:

bool LoopFusion::ContainsBarriersOrFunctionCalls(Loop* loop) {
  for (const auto& block : loop->GetBlocks()) {
    for (const auto& inst : *containing_function_->FindBlock(block)) {
      auto opcode = inst.opcode();
      if (opcode == spv::Op::OpFunctionCall ||
          opcode == spv::Op::OpControlBarrier ||
          opcode == spv::Op::OpMemoryBarrier ||
          opcode == spv::Op::OpTypeNamedBarrier ||
          opcode == spv::Op::OpNamedBarrierInitialize ||
          opcode == spv::Op::OpMemoryNamedBarrier) {
        return true;
      }
    }
  }

  return false;
}